

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.h
# Opt level: O3

void __thiscall
cmCommandArgumentParserHelper::cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  this->InputBufferPos = 1;
  this->LastTokenLength = 0;
  this->InputSize = 0;
  (this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Variables).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Variables).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Variables).
  super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Result)._M_dataplus._M_p = (pointer)&(this->Result).field_2;
  (this->Result)._M_string_length = 0;
  (this->Result).field_2._M_local_buf[0] = '\0';
  (this->ErrorString)._M_dataplus._M_p = (pointer)&(this->ErrorString).field_2;
  (this->ErrorString)._M_string_length = 0;
  (this->ErrorString).field_2._M_local_buf[0] = '\0';
  this->FileLine = -1;
  this->FileName = (char *)0x0;
  this->RemoveEmpty = true;
  this->NoEscapeMode = false;
  this->ReplaceAtSyntax = false;
  return;
}

Assistant:

cmCommandArgumentParserHelper(cmCommandArgumentParserHelper const&) = delete;